

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_data__wrap_t____gles_sampler_wrap_enum
          (ColladaParserAutoGen15Private *this,ParserChar *text,size_t textLength)

{
  ParserChar **ppPVar1;
  ParserChar *pPVar2;
  ParserChar *pPVar3;
  StackMemoryManager *this_00;
  ParserChar *__dest;
  
  this_00 = &(this->
             super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
             ).super_ParserTemplateBase.mStackMemoryManager;
  if ((this->
      super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
      ).super_ParserTemplateBase.mLastIncompleteFragmentInCharacterData == (ParserChar *)0x0) {
    pPVar3 = (ParserChar *)GeneratedSaxParser::StackMemoryManager::newObject(this_00,textLength);
    (this->
    super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ).super_ParserTemplateBase.mLastIncompleteFragmentInCharacterData = pPVar3;
    memcpy(pPVar3,text,textLength);
    (this->
    super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ).super_ParserTemplateBase.mEndOfDataInCurrentObjectOnStack =
         (this->
         super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
         ).super_ParserTemplateBase.mLastIncompleteFragmentInCharacterData + textLength;
  }
  else {
    pPVar2 = (ParserChar *)GeneratedSaxParser::StackMemoryManager::growObject(this_00,textLength);
    pPVar3 = (this->
             super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
             ).super_ParserTemplateBase.mLastIncompleteFragmentInCharacterData;
    __dest = (this->
             super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
             ).super_ParserTemplateBase.mEndOfDataInCurrentObjectOnStack;
    if (pPVar2 != pPVar3) {
      __dest = pPVar2 + ((long)__dest - (long)pPVar3);
      (this->
      super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
      ).super_ParserTemplateBase.mEndOfDataInCurrentObjectOnStack = __dest;
      (this->
      super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
      ).super_ParserTemplateBase.mLastIncompleteFragmentInCharacterData = pPVar2;
    }
    memcpy(__dest,text,textLength);
    ppPVar1 = &(this->
               super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
               ).super_ParserTemplateBase.mEndOfDataInCurrentObjectOnStack;
    *ppPVar1 = *ppPVar1 + textLength;
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_data__wrap_t____gles_sampler_wrap_enum( const ParserChar* text, size_t textLength )
{
if (!mLastIncompleteFragmentInCharacterData)
{
    mLastIncompleteFragmentInCharacterData = (ParserChar*)mStackMemoryManager.newObject(textLength);
    memcpy(mLastIncompleteFragmentInCharacterData, text, textLength);
    mEndOfDataInCurrentObjectOnStack = mLastIncompleteFragmentInCharacterData + textLength;
}
else
{
    ParserChar* tmp = (ParserChar*)mStackMemoryManager.growObject(textLength);
    if ( tmp != mLastIncompleteFragmentInCharacterData ) {
        mEndOfDataInCurrentObjectOnStack = (mEndOfDataInCurrentObjectOnStack - mLastIncompleteFragmentInCharacterData) + tmp;
        mLastIncompleteFragmentInCharacterData = tmp;
    }
    memcpy(mEndOfDataInCurrentObjectOnStack, text, textLength);
    mEndOfDataInCurrentObjectOnStack += textLength;
}
return true;
}